

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O3

void __thiscall cmRST::Reset(cmRST *this)

{
  bool inlineMarkup;
  
  if ((this->MarkupLines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->MarkupLines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    UnindentLines(&this->MarkupLines);
  }
  switch(this->Directive) {
  case DirectiveParsedLiteral:
    inlineMarkup = true;
    goto LAB_0034916c;
  case DirectiveLiteralBlock:
  case DirectiveCodeBlock:
    inlineMarkup = false;
LAB_0034916c:
    OutputMarkupLines(this,inlineMarkup);
    break;
  case DirectiveReplace:
    ProcessDirectiveReplace(this);
    break;
  case DirectiveTocTree:
    ProcessDirectiveTocTree(this);
  }
  this->Markup = MarkupNone;
  this->Directive = DirectiveNone;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->MarkupLines,
                    (this->MarkupLines).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void cmRST::Reset()
{
  if(!this->MarkupLines.empty())
    {
    this->UnindentLines(this->MarkupLines);
    }
  switch(this->Directive)
    {
    case DirectiveNone: break;
    case DirectiveParsedLiteral: this->ProcessDirectiveParsedLiteral(); break;
    case DirectiveLiteralBlock: this->ProcessDirectiveLiteralBlock(); break;
    case DirectiveCodeBlock: this->ProcessDirectiveCodeBlock(); break;
    case DirectiveReplace: this->ProcessDirectiveReplace(); break;
    case DirectiveTocTree: this->ProcessDirectiveTocTree(); break;
    }
  this->Markup = MarkupNone;
  this->Directive = DirectiveNone;
  this->MarkupLines.clear();
}